

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

FT_Error T1_Set_MM_Design(T1_Face face,FT_UInt num_coords,FT_Long *coords)

{
  PS_DesignMapRec *pPVar1;
  PS_Blend pPVar2;
  long *plVar3;
  FT_Long *pFVar4;
  long lVar5;
  FT_Error FVar6;
  FT_Long in_RAX;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  FT_Long FVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  char cVar16;
  FT_Fixed final_blends [16];
  FT_Fixed local_b8 [17];
  
  pPVar2 = face->blend;
  if (pPVar2 == (PS_Blend)0x0) {
    FVar6 = 6;
  }
  else {
    uVar8 = (ulong)num_coords;
    uVar11 = pPVar2->num_axis;
    if (uVar11 < num_coords) {
      uVar8 = (ulong)uVar11;
    }
    if (uVar11 != 0) {
      uVar7 = 0;
      do {
        pPVar1 = pPVar2->design_map + uVar7;
        plVar3 = pPVar1->design_points;
        if (uVar7 < uVar8) {
          FVar10 = coords[uVar7];
        }
        else {
          FVar10 = (plVar3[(ulong)pPVar1->num_points - 1] - *plVar3) / 2;
        }
        pFVar4 = pPVar2->design_map[uVar7].blend_points;
        uVar9 = (ulong)pPVar1->num_points;
        if (uVar9 == 0) {
          uVar13 = 0xffffffff;
          uVar11 = 0xffffffff;
        }
        else {
          uVar12 = 0xffffffff;
          uVar15 = 0;
          uVar14 = 0xffffffff;
          do {
            lVar5 = plVar3[uVar15];
            if (FVar10 == lVar5) {
              in_RAX = pFVar4[uVar15];
              cVar16 = '\b';
            }
            else {
              cVar16 = (FVar10 < lVar5) * '\x05';
              if (FVar10 < lVar5) {
                uVar12 = uVar15 & 0xffffffff;
              }
              else {
                uVar14 = uVar15 & 0xffffffff;
              }
            }
            uVar11 = (uint)uVar12;
            uVar13 = (uint)uVar14;
            if (cVar16 != '\0') {
              if (cVar16 != '\x05') goto LAB_00177ff2;
              break;
            }
            uVar15 = uVar15 + 1;
          } while (uVar9 != uVar15);
        }
        if ((int)uVar13 < 0) {
          in_RAX = *pFVar4;
        }
        else if ((int)uVar11 < 0) {
          in_RAX = pFVar4[uVar9 - 1];
        }
        else {
          in_RAX = FT_MulDiv(FVar10 - plVar3[uVar13],pFVar4[uVar11] - pFVar4[uVar13],
                             plVar3[uVar11] - plVar3[uVar13]);
        }
LAB_00177ff2:
        local_b8[uVar7] = in_RAX;
        uVar7 = uVar7 + 1;
        uVar11 = pPVar2->num_axis;
      } while (uVar7 < uVar11);
    }
    FVar6 = t1_set_mm_blend(face,uVar11,local_b8);
    if (FVar6 == 0) {
      (face->root).face_flags =
           (ulong)((int)uVar8 != 0) << 0xf | (face->root).face_flags & 0xffffffffffff7fffU;
      FVar6 = 0;
    }
  }
  return FVar6;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Set_MM_Design( T1_Face   face,
                    FT_UInt   num_coords,
                    FT_Long*  coords )
  {
    FT_Error  error;
    PS_Blend  blend = face->blend;
    FT_UInt   n, p;
    FT_Fixed  final_blends[T1_MAX_MM_DESIGNS];


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    if ( num_coords > blend->num_axis )
      num_coords = blend->num_axis;

    /* compute the blend coordinates through the blend design map */

    for ( n = 0; n < blend->num_axis; n++ )
    {
      FT_Long       design;
      FT_Fixed      the_blend;
      PS_DesignMap  map     = blend->design_map + n;
      FT_Long*      designs = map->design_points;
      FT_Fixed*     blends  = map->blend_points;
      FT_Int        before  = -1, after = -1;


      /* use a default value if we don't have a coordinate */
      if ( n < num_coords )
        design = coords[n];
      else
        design = ( designs[map->num_points - 1] - designs[0] ) / 2;

      for ( p = 0; p < (FT_UInt)map->num_points; p++ )
      {
        FT_Long  p_design = designs[p];


        /* exact match? */
        if ( design == p_design )
        {
          the_blend = blends[p];
          goto Found;
        }

        if ( design < p_design )
        {
          after = (FT_Int)p;
          break;
        }

        before = (FT_Int)p;
      }

      /* now interpolate if necessary */
      if ( before < 0 )
        the_blend = blends[0];

      else if ( after < 0 )
        the_blend = blends[map->num_points - 1];

      else
        the_blend = FT_MulDiv( design         - designs[before],
                               blends [after] - blends [before],
                               designs[after] - designs[before] );

    Found:
      final_blends[n] = the_blend;
    }

    error = t1_set_mm_blend( face, blend->num_axis, final_blends );
    if ( error )
      return error;

    if ( num_coords )
      face->root.face_flags |= FT_FACE_FLAG_VARIATION;
    else
      face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;

    return FT_Err_Ok;
  }